

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BlitColorConversionCase::render(BlitColorConversionCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 *pdVar1;
  float *pfVar2;
  float fVar3;
  deUint32 internalformat;
  int srcY1;
  deUint32 *renderbuffers;
  int i;
  DataType outputType;
  DataType outputType_00;
  deUint32 program;
  deUint32 program_00;
  long lVar4;
  Vec4 *pVVar5;
  Context *pCVar6;
  deUint32 *pdVar7;
  deUint32 *pdVar8;
  int i_1;
  Vec4 *pVVar9;
  int i_2;
  Vec4 *pVVar10;
  TextureFormatInfo *pTVar11;
  Vec4 *pVVar12;
  TextureFormatInfo *pTVar13;
  Vec4 *pVVar14;
  Vec4 *pVVar15;
  Vec4 *pVVar16;
  int i_11;
  TextureFormatInfo *pTVar17;
  Vec4 *pVVar18;
  int i_14;
  Vec4 *pVVar19;
  int iVar20;
  deUint32 *framebuffers;
  deUint32 dstFbo;
  BVec4 srcIsGreater;
  BVec4 copyMask;
  deUint32 srcFbo;
  deUint32 srcRbo;
  BlitColorConversionCase *local_458;
  deUint32 dstRbo;
  Vector<float,_4> res_11;
  Vector<bool,_4> res_21;
  Vector<bool,_4> res_22;
  Vector<bool,_4> res_18;
  Vector<bool,_4> res_19;
  Vector<bool,_4> res_4;
  TextureFormat dstFormat;
  TextureFormatInfo dstRangeInfo;
  TextureFormat srcFormat;
  TextureFormatInfo dstFmtRangeInfo;
  TextureFormatInfo srcFmtRangeInfo;
  TextureFormatInfo srcRangeInfo;
  GradientShader gradientToDstShader;
  GradientShader gradientToSrcShader;
  
  srcFormat = glu::mapGLInternalFormat(this->m_srcFormat);
  local_458 = this;
  dstFormat = glu::mapGLInternalFormat(this->m_dstFormat);
  outputType = FboTestUtil::getFragmentOutputType(&srcFormat);
  outputType_00 = FboTestUtil::getFragmentOutputType(&dstFormat);
  pTVar11 = &srcFmtRangeInfo;
  tcu::getTextureFormatInfo(pTVar11,&srcFormat);
  pTVar17 = &dstFmtRangeInfo;
  tcu::getTextureFormatInfo(pTVar17,&dstFormat);
  switch(srcFormat.order) {
  case RG:
    gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,0x101);
    break;
  case RA:
  case ARGB:
  case BGR:
  case BGRA:
  case sR:
  case sRG:
switchD_006c667b_caseD_6:
    gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         ((ulong)gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_
         << 0x20);
    break;
  case RGB:
  case sRGB:
    gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,0x10101);
    break;
  case RGBA:
  case sRGBA:
    gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,0x1010101);
    break;
  default:
    if (srcFormat.order != R) goto switchD_006c667b_caseD_6;
    gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,1);
  }
  switch(dstFormat.order) {
  case RG:
    gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,0x101);
    break;
  case RGB:
  case sRGB:
    gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,0x10101);
    break;
  case RGBA:
  case sRGBA:
    gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         CONCAT44(gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                  _4_4_,0x1010101);
    break;
  default:
    if (dstFormat.order == R) {
      gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
           (_func_int **)
           CONCAT44(gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader.
                    _4_4_,1);
      break;
    }
  case RA:
  case ARGB:
  case BGR:
  case BGRA:
  case sR:
  case sRG:
    gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
         (_func_int **)
         ((ulong)gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_
         << 0x20);
  }
  copyMask.m_data[0] = false;
  copyMask.m_data[1] = false;
  copyMask.m_data[2] = false;
  copyMask.m_data[3] = false;
  lVar4 = 0;
  do {
    copyMask.m_data[lVar4] =
         (bool)(*(byte *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader.
                                 _vptr_VertexShader + lVar4) &
               *(byte *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader.
                                _vptr_VertexShader + lVar4));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pVVar5 = &srcFmtRangeInfo.valueMax;
  gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar4 * 4) =
         srcFmtRangeInfo.valueMax.m_data[lVar4] - srcFmtRangeInfo.valueMin.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pVVar9 = &dstFmtRangeInfo.valueMax;
  gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar4 * 4) =
         dstFmtRangeInfo.valueMax.m_data[lVar4] - dstFmtRangeInfo.valueMin.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  srcIsGreater.m_data[0] = false;
  srcIsGreater.m_data[1] = false;
  srcIsGreater.m_data[2] = false;
  srcIsGreater.m_data[3] = false;
  lVar4 = 0;
  do {
    fVar3 = *(float *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader.
                              _vptr_VertexShader + lVar4 * 4);
    pfVar2 = (float *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader.
                              _vptr_VertexShader + lVar4 * 4);
    srcIsGreater.m_data[lVar4] = *pfVar2 <= fVar3 && fVar3 != *pfVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  _res_4 = (undefined1 *)((ulong)_res_4 & 0xffffffff00000000);
  lVar4 = 0;
  do {
    res_4.m_data[lVar4] = (bool)(srcIsGreater.m_data[lVar4] & copyMask.m_data[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar4 = 0;
  do {
    pTVar13 = pTVar17;
    if (res_4.m_data[lVar4] == false) {
      pTVar13 = pTVar11;
    }
    *(float *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar4 * 4) = (pTVar13->valueMin).m_data[0];
    lVar4 = lVar4 + 1;
    pTVar11 = (TextureFormatInfo *)((pTVar11->valueMin).m_data + 1);
    pTVar17 = (TextureFormatInfo *)((pTVar17->valueMin).m_data + 1);
  } while (lVar4 != 4);
  srcFbo = 0;
  lVar4 = 0;
  do {
    *(char *)((long)&srcFbo + lVar4) = srcIsGreater.m_data[lVar4] & copyMask.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar4 = 0;
  pVVar14 = pVVar9;
  pVVar15 = pVVar5;
  do {
    pVVar10 = pVVar14;
    if (*(char *)((long)&srcFbo + lVar4) == '\0') {
      pVVar10 = pVVar15;
    }
    *(float *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar4 * 4) = pVVar10->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar15 = (Vec4 *)(pVVar15->m_data + 1);
    pVVar14 = (Vec4 *)(pVVar14->m_data + 1);
  } while (lVar4 != 4);
  pVVar14 = &dstFmtRangeInfo.lookupScale;
  dstFbo = 0;
  lVar4 = 0;
  do {
    (&srcIsGreater)[-1].m_data[lVar4] = (bool)(srcIsGreater.m_data[lVar4] & copyMask.m_data[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pVVar15 = &srcFmtRangeInfo.lookupScale;
  dstRangeInfo.valueMin.m_data[0] = 0.0;
  dstRangeInfo.valueMin.m_data[1] = 0.0;
  dstRangeInfo.valueMin.m_data[2] = 0.0;
  dstRangeInfo.valueMin.m_data[3] = 0.0;
  lVar4 = 0;
  pVVar10 = pVVar14;
  pVVar16 = pVVar15;
  do {
    pVVar18 = pVVar10;
    if ((&srcIsGreater)[-1].m_data[lVar4] == false) {
      pVVar18 = pVVar16;
    }
    dstRangeInfo.valueMin.m_data[lVar4] = pVVar18->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar16 = (Vec4 *)(pVVar16->m_data + 1);
    pVVar10 = (Vec4 *)(pVVar10->m_data + 1);
  } while (lVar4 != 4);
  pVVar10 = &dstFmtRangeInfo.lookupBias;
  srcRbo = 0;
  lVar4 = 0;
  do {
    *(char *)((long)&srcRbo + lVar4) = srcIsGreater.m_data[lVar4] & copyMask.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pVVar16 = &srcFmtRangeInfo.lookupBias;
  res_11.m_data[0] = 0.0;
  res_11.m_data[1] = 0.0;
  res_11.m_data[2] = 0.0;
  res_11.m_data[3] = 0.0;
  lVar4 = 0;
  pVVar18 = pVVar10;
  pVVar19 = pVVar16;
  do {
    pVVar12 = pVVar18;
    if (*(char *)((long)&srcRbo + lVar4) == '\0') {
      pVVar12 = pVVar19;
    }
    res_11.m_data[lVar4] = pVVar12->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar19 = (Vec4 *)(pVVar19->m_data + 1);
    pVVar18 = (Vec4 *)(pVVar18->m_data + 1);
  } while (lVar4 != 4);
  srcRangeInfo.valueMin.m_data._0_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  srcRangeInfo.valueMin.m_data._8_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  srcRangeInfo.valueMax.m_data._0_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  srcRangeInfo.valueMax.m_data._8_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  srcRangeInfo.lookupScale.m_data[0] = dstRangeInfo.valueMin.m_data[0];
  srcRangeInfo.lookupScale.m_data[1] = dstRangeInfo.valueMin.m_data[1];
  srcRangeInfo.lookupScale.m_data[2] = dstRangeInfo.valueMin.m_data[2];
  srcRangeInfo.lookupScale.m_data[3] = dstRangeInfo.valueMin.m_data[3];
  srcRangeInfo.lookupBias.m_data[0] = res_11.m_data[0];
  srcRangeInfo.lookupBias.m_data[1] = res_11.m_data[1];
  srcRangeInfo.lookupBias.m_data[2] = res_11.m_data[2];
  srcRangeInfo.lookupBias.m_data[3] = res_11.m_data[3];
  dstFbo = 0;
  lVar4 = 0;
  do {
    (&srcIsGreater)[-1].m_data[lVar4] = (bool)(copyMask.m_data[lVar4] ^ 1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  srcFbo = 0;
  lVar4 = 0;
  do {
    *(char *)((long)&srcFbo + lVar4) =
         srcIsGreater.m_data[lVar4] | (&srcIsGreater)[-1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar11 = &srcFmtRangeInfo;
  pTVar17 = &dstFmtRangeInfo;
  lVar4 = 0;
  do {
    pTVar13 = pTVar17;
    if (*(char *)((long)&srcFbo + lVar4) == '\0') {
      pTVar13 = pTVar11;
    }
    *(float *)((long)&gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar4 * 4) = (pTVar13->valueMin).m_data[0];
    lVar4 = lVar4 + 1;
    pTVar11 = (TextureFormatInfo *)((pTVar11->valueMin).m_data + 1);
    pTVar17 = (TextureFormatInfo *)((pTVar17->valueMin).m_data + 1);
  } while (lVar4 != 4);
  dstRbo = 0;
  lVar4 = 0;
  do {
    *(byte *)((long)res_11.m_data + lVar4 + -4) = copyMask.m_data[lVar4] ^ 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  srcRbo = 0;
  lVar4 = 0;
  do {
    *(byte *)((long)&srcRbo + lVar4) =
         srcIsGreater.m_data[lVar4] | *(byte *)((long)res_11.m_data + lVar4 + -4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar4 = 0;
  do {
    pVVar18 = pVVar9;
    if (*(char *)((long)&srcRbo + lVar4) == '\0') {
      pVVar18 = pVVar5;
    }
    *(float *)((long)&gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
              + lVar4 * 4) = pVVar18->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar5 = (Vec4 *)(pVVar5->m_data + 1);
    pVVar9 = (Vec4 *)(pVVar9->m_data + 1);
  } while (lVar4 != 4);
  res_18.m_data[0] = false;
  res_18.m_data[1] = false;
  res_18.m_data[2] = false;
  res_18.m_data[3] = false;
  lVar4 = 0;
  do {
    res_18.m_data[lVar4] = (bool)(copyMask.m_data[lVar4] ^ 1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_19.m_data[0] = false;
  res_19.m_data[1] = false;
  res_19.m_data[2] = false;
  res_19.m_data[3] = false;
  lVar4 = 0;
  do {
    res_19.m_data[lVar4] = (bool)(srcIsGreater.m_data[lVar4] | res_18.m_data[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_11.m_data[0] = 0.0;
  res_11.m_data[1] = 0.0;
  res_11.m_data[2] = 0.0;
  res_11.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    pVVar5 = pVVar14;
    if (res_19.m_data[lVar4] == false) {
      pVVar5 = pVVar15;
    }
    res_11.m_data[lVar4] = pVVar5->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar15 = (Vec4 *)(pVVar15->m_data + 1);
    pVVar14 = (Vec4 *)(pVVar14->m_data + 1);
  } while (lVar4 != 4);
  res_21.m_data[0] = false;
  res_21.m_data[1] = false;
  res_21.m_data[2] = false;
  res_21.m_data[3] = false;
  lVar4 = 0;
  do {
    res_21.m_data[lVar4] = (bool)(copyMask.m_data[lVar4] ^ 1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_22.m_data[0] = false;
  res_22.m_data[1] = false;
  res_22.m_data[2] = false;
  res_22.m_data[3] = false;
  lVar4 = 0;
  do {
    res_22.m_data[lVar4] = (bool)(srcIsGreater.m_data[lVar4] | res_21.m_data[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  _res_4 = (undefined1 *)0x0;
  lVar4 = 0;
  do {
    pVVar5 = pVVar10;
    if (res_22.m_data[lVar4] == false) {
      pVVar5 = pVVar16;
    }
    *(float *)(&res_4)[lVar4].m_data = pVVar5->m_data[0];
    lVar4 = lVar4 + 1;
    pVVar16 = (Vec4 *)(pVVar16->m_data + 1);
    pVVar10 = (Vec4 *)(pVVar10->m_data + 1);
  } while (lVar4 != 4);
  dstRangeInfo.valueMin.m_data._0_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  dstRangeInfo.valueMin.m_data._8_8_ =
       gradientToSrcShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  dstRangeInfo.valueMax.m_data._0_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader;
  dstRangeInfo.valueMax.m_data._8_8_ =
       gradientToDstShader.super_ShaderProgram.super_VertexShader.m_inputs.
       super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  dstRangeInfo.lookupScale.m_data[0] = res_11.m_data[0];
  dstRangeInfo.lookupScale.m_data[1] = res_11.m_data[1];
  dstRangeInfo.lookupScale.m_data[2] = res_11.m_data[2];
  dstRangeInfo.lookupScale.m_data[3] = res_11.m_data[3];
  dstRangeInfo.lookupBias.m_data._0_8_ = _res_4;
  dstRangeInfo.lookupBias.m_data[2] = 0.0;
  dstRangeInfo.lookupBias.m_data[3] = 0.0;
  FboTestUtil::GradientShader::GradientShader(&gradientToSrcShader,outputType);
  FboTestUtil::GradientShader::GradientShader(&gradientToDstShader,outputType_00);
  this_00 = &(local_458->super_FboTestCase).super_ContextWrapper;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&gradientToSrcShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_00 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&gradientToDstShader);
  iVar20 = 1;
  pdVar8 = &local_458->m_srcFormat;
  pdVar1 = &local_458->m_dstFormat;
  do {
    framebuffers = &dstFbo;
    if (iVar20 == 1) {
      framebuffers = &srcFbo;
    }
    pdVar7 = pdVar1;
    renderbuffers = &dstRbo;
    if (iVar20 == 1) {
      pdVar7 = pdVar8;
      renderbuffers = &srcRbo;
    }
    internalformat = *pdVar7;
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,framebuffers);
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorage
              (this_00,0x8d41,internalformat,(local_458->m_size).m_data[0],
               (local_458->m_size).m_data[1]);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers);
    FboTestCase::checkError(&local_458->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&local_458->super_FboTestCase,0x8d40);
    iVar20 = iVar20 + -1;
  } while (iVar20 == 0);
  sglr::ContextWrapper::glViewport
            (this_00,0,0,(local_458->m_size).m_data[0],(local_458->m_size).m_data[1]);
  iVar20 = 1;
  do {
    pdVar8 = &dstFbo;
    if (iVar20 == 1) {
      pdVar8 = &srcFbo;
    }
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*pdVar8);
    if (iVar20 == 1) {
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      FboTestUtil::GradientShader::setGradient
                (&gradientToSrcShader,pCVar6,program,&srcRangeInfo.valueMin,&dstRangeInfo.valueMax);
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      res_11.m_data[0] = -1.0;
      res_11.m_data[1] = -1.0;
      res_11.m_data._8_8_ = res_11.m_data._8_8_ & 0xffffffff00000000;
      _res_4 = &DAT_3f8000003f800000;
      sglr::drawQuad(pCVar6,program,(Vec3 *)&res_11,(Vec3 *)&res_4);
    }
    else {
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      FboTestUtil::GradientShader::setGradient
                (&gradientToDstShader,pCVar6,program_00,&dstRangeInfo.valueMax,
                 &dstRangeInfo.valueMin);
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      res_11.m_data[0] = -1.0;
      res_11.m_data[1] = -1.0;
      res_11.m_data._8_8_ = res_11.m_data._8_8_ & 0xffffffff00000000;
      _res_4 = &DAT_3f8000003f800000;
      sglr::drawQuad(pCVar6,program_00,(Vec3 *)&res_11,(Vec3 *)&res_4);
    }
    iVar20 = iVar20 + -1;
  } while (iVar20 == 0);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,srcFbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,dstFbo);
  iVar20 = (local_458->m_size).m_data[0];
  srcY1 = (local_458->m_size).m_data[1];
  sglr::ContextWrapper::glBlitFramebuffer(this_00,0,0,iVar20,srcY1,0,0,iVar20,srcY1,0x4000,0x2600);
  FboTestCase::checkError(&local_458->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,dstFbo);
  FboTestCase::readPixels
            (&local_458->super_FboTestCase,dst,0,0,(local_458->m_size).m_data[0],
             (local_458->m_size).m_data[1],&dstFormat,&dstRangeInfo.lookupScale,
             &dstRangeInfo.lookupBias);
  sglr::ShaderProgram::~ShaderProgram(&gradientToDstShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&gradientToSrcShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		srcFormat			= glu::mapGLInternalFormat(m_srcFormat);
		tcu::TextureFormat		dstFormat			= glu::mapGLInternalFormat(m_dstFormat);
		glu::DataType			srcOutputType		= getFragmentOutputType(srcFormat);
		glu::DataType			dstOutputType		= getFragmentOutputType(dstFormat);

		// Compute ranges \note Doesn't handle case where src or dest is not subset of the another!
		tcu::TextureFormatInfo	srcFmtRangeInfo		= tcu::getTextureFormatInfo(srcFormat);
		tcu::TextureFormatInfo	dstFmtRangeInfo		= tcu::getTextureFormatInfo(dstFormat);
		tcu::BVec4				copyMask			= tcu::logicalAnd(getChannelMask(srcFormat.order), getChannelMask(dstFormat.order));
		tcu::BVec4				srcIsGreater		= tcu::greaterThan(srcFmtRangeInfo.valueMax-srcFmtRangeInfo.valueMin, dstFmtRangeInfo.valueMax-dstFmtRangeInfo.valueMin);
		tcu::TextureFormatInfo	srcRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalAnd(copyMask, srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalAnd(copyMask, srcIsGreater)));
		tcu::TextureFormatInfo	dstRangeInfo		(tcu::select(dstFmtRangeInfo.valueMin,		srcFmtRangeInfo.valueMin,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.valueMax,		srcFmtRangeInfo.valueMax,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupScale,	srcFmtRangeInfo.lookupScale,	tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)),
													 tcu::select(dstFmtRangeInfo.lookupBias,	srcFmtRangeInfo.lookupBias,		tcu::logicalOr(tcu::logicalNot(copyMask), srcIsGreater)));

		// Shaders.
		GradientShader			gradientToSrcShader	(srcOutputType);
		GradientShader			gradientToDstShader	(dstOutputType);

		deUint32				gradShaderSrcID		= getCurrentContext()->createProgram(&gradientToSrcShader);
		deUint32				gradShaderDstID		= getCurrentContext()->createProgram(&gradientToDstShader);

		deUint32				srcFbo, dstFbo;
		deUint32				srcRbo, dstRbo;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo		= ndx ? dstFbo : srcFbo;
			deUint32&	rbo		= ndx ? dstRbo : srcRbo;
			deUint32	format	= ndx ? m_dstFormat : m_srcFormat;

			glGenFramebuffers(1, &fbo);
			glGenRenderbuffers(1, &rbo);

			glBindRenderbuffer(GL_RENDERBUFFER, rbo);
			glRenderbufferStorage(GL_RENDERBUFFER, format, m_size.x(), m_size.y());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glViewport(0, 0, m_size.x(), m_size.y());

		// Render gradients.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			glBindFramebuffer(GL_FRAMEBUFFER, ndx ? dstFbo : srcFbo);

			if (ndx)
			{
				gradientToDstShader.setGradient(*getCurrentContext(), gradShaderDstID, dstRangeInfo.valueMax, dstRangeInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), gradShaderDstID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
			else
			{
				gradientToSrcShader.setGradient(*getCurrentContext(), gradShaderSrcID, srcRangeInfo.valueMin, dstRangeInfo.valueMax);
				sglr::drawQuad(*getCurrentContext(), gradShaderSrcID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}
		}

		// Execute copy.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, srcFbo);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, dstFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
		checkError();

		// Read results.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, dstFbo);
		readPixels(dst, 0, 0, m_size.x(), m_size.y(), dstFormat, dstRangeInfo.lookupScale, dstRangeInfo.lookupBias);
	}